

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixError(anon_unknown_1 *this,string *context,int error_number)

{
  Slice local_38;
  Slice local_28;
  
  if (error_number == 2) {
    local_28.data_ = (context->_M_dataplus)._M_p;
    local_28.size_ = context->_M_string_length;
    local_38.data_ = strerror(2);
    local_38.size_ = strlen(local_38.data_);
    Status::NotFound((Status *)this,&local_28,&local_38);
  }
  else {
    local_28.data_ = (context->_M_dataplus)._M_p;
    local_28.size_ = context->_M_string_length;
    local_38.data_ = strerror(error_number);
    local_38.size_ = strlen(local_38.data_);
    Status::IOError((Status *)this,&local_28,&local_38);
  }
  return (Status)(char *)this;
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}